

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O3

void __thiscall wasm::Fuzzer::checkSubtypes(Fuzzer *this)

{
  ostream *poVar1;
  uint uVar2;
  pointer pvVar3;
  uint *puVar4;
  char cVar5;
  pointer pHVar6;
  pointer pHVar7;
  ulong uVar8;
  uint *puVar9;
  undefined1 local_1b8 [392];
  
  pHVar6 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_start;
  pHVar7 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pHVar7 != pHVar6) {
    uVar8 = 0;
    do {
      pvVar3 = (this->subtypeIndices).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar9 = pvVar3[uVar8].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
      puVar4 = *(pointer *)
                ((long)&pvVar3[uVar8].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (puVar9 != puVar4) {
        do {
          uVar2 = *puVar9;
          pHVar6 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          cVar5 = wasm::HeapType::isSubType((HeapType)pHVar6[uVar2].id,(HeapType)pHVar6[uVar8].id);
          if (cVar5 == '\0') {
            Fatal::Fatal((Fatal *)local_1b8);
            poVar1 = (ostream *)(local_1b8 + 0x10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"HeapType ",9);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar1," should be a subtype of HeapType ",0x21);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1," but is not!\n",0xd);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
            wasm::operator<<(poVar1,(HeapType)
                                    (this->types).
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar2].id);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
            wasm::operator<<(poVar1,(HeapType)
                                    (this->types).
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar8].id);
            Fatal::operator<<((Fatal *)local_1b8,(char (*) [2])0x162f76);
            Fatal::~Fatal((Fatal *)local_1b8);
          }
          puVar9 = puVar9 + 1;
        } while (puVar9 != puVar4);
        pHVar6 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pHVar7 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)pHVar7 - (long)pHVar6 >> 3));
  }
  return;
}

Assistant:

void Fuzzer::checkSubtypes() const {
  for (size_t super = 0; super < types.size(); ++super) {
    for (auto sub : subtypeIndices[super]) {
      if (!HeapType::isSubType(types[sub], types[super])) {
        Fatal() << "HeapType " << sub << " should be a subtype of HeapType "
                << super << " but is not!\n"
                << sub << ": " << types[sub] << "\n"
                << super << ": " << types[super] << "\n";
      }
    }
  }
}